

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voting.cpp
# Opt level: O0

void __thiscall holder::holder(holder *this,string *n)

{
  string local_38 [32];
  string *local_18;
  string *n_local;
  holder *this_local;
  
  local_18 = n;
  n_local = &this->name;
  std::__cxx11::string::string(local_38,(string *)n);
  lower_string(&this->name);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

holder(std::string n) : name{lower_string(n)}
    {
    }